

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

bool ON_BytesToHexadecimalString
               (ON__UINT8 *bytes,size_t byte_count,bool bCapitalDigits,bool bReverse,char *str,
               size_t str_capacity)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char local_56;
  int local_54;
  ON__UINT8 b;
  int i;
  int delta_byte;
  int c;
  size_t j;
  int A_minus_10;
  size_t str_capacity_local;
  char *str_local;
  bool bReverse_local;
  bool bCapitalDigits_local;
  size_t byte_count_local;
  ON__UINT8 *bytes_local;
  
  if ((((str == (char *)0x0) || (str_capacity < byte_count << 1)) || (byte_count == 0)) ||
     (bytes == (ON__UINT8 *)0x0)) {
    if ((str != (char *)0x0) && (str_capacity != 0)) {
      *str = '\0';
    }
    bytes_local._7_1_ = false;
  }
  else {
    local_56 = 'A';
    if (!bCapitalDigits) {
      local_56 = 'a';
    }
    _delta_byte = 0;
    byte_count_local = (size_t)bytes;
    if (bReverse) {
      byte_count_local = (size_t)(bytes + 0x13);
    }
    iVar3 = 1;
    if (bReverse) {
      iVar3 = -1;
    }
    for (local_54 = 0; local_54 < 0x14; local_54 = local_54 + 1) {
      bVar1 = *(byte *)byte_count_local;
      byte_count_local = byte_count_local + (long)iVar3;
      uVar4 = bVar1 / 0x10;
      cVar2 = (char)uVar4;
      if (uVar4 < 10) {
        i._0_1_ = cVar2 + '0';
      }
      else {
        i._0_1_ = local_56 + -10 + cVar2;
      }
      if (_delta_byte < str_capacity) {
        str[_delta_byte] = (char)i;
        _delta_byte = _delta_byte + 1;
      }
      uVar4 = (uint)bVar1 % 0x10;
      cVar2 = (char)uVar4;
      if (uVar4 < 10) {
        i._0_1_ = cVar2 + '0';
      }
      else {
        i._0_1_ = local_56 + -10 + cVar2;
      }
      if (_delta_byte < str_capacity) {
        str[_delta_byte] = (char)i;
        _delta_byte = _delta_byte + 1;
      }
    }
    if (_delta_byte < str_capacity) {
      str[_delta_byte] = '\0';
    }
    bytes_local._7_1_ = true;
  }
  return bytes_local._7_1_;
}

Assistant:

static bool ON_BytesToHexadecimalString(
  const ON__UINT8* bytes,
  size_t byte_count,
  bool bCapitalDigits,
  bool bReverse,
  char* str,
  size_t str_capacity
  )
{
  if (nullptr == str || str_capacity < 2*byte_count || byte_count <= 0 || nullptr == bytes )
  {
    if (nullptr != str && str_capacity > 0)
      str[0] = 0;
    return false;
  }
  const int A_minus_10 = (bCapitalDigits ? 'A' : 'a') - 10;
  size_t j = 0;
  int c;
  if ( bReverse )
    bytes += 19;
  const int delta_byte = bReverse ? -1 : 1;
  for (int i = 0; i < 20; i++)
  {
    ON__UINT8 b = *bytes;
    bytes += delta_byte;
    c = (int)(b / 16);
    if (c < 10)
      c += '0';
    else
      c += A_minus_10;
    if (j < str_capacity)
      str[j++] = (char)c;
    c = (int)(b % 16);
    if (c < 10)
      c += '0';
    else
      c += A_minus_10;
    if (j < str_capacity)
      str[j++] = (char)c;
  }
  if ((size_t)j < str_capacity)
    str[j] = 0;
  return true;
}